

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bool.cpp
# Opt level: O0

void bool_rel(BoolView *x,BoolRelType t,BoolView *y,BoolView *z)

{
  bool bVar1;
  int iVar2;
  uint in_ESI;
  undefined1 *puVar3;
  bool p;
  int m_1;
  vec<Lit> ps;
  int m;
  bool pass;
  int k;
  int flags;
  int j;
  int i;
  int l;
  int u;
  BoolView v [3];
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  BoolView *in_stack_ffffffffffffff08;
  anon_union_8_2_743a5d44_for_Reason_0 in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff20;
  Lit in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  SAT *in_stack_ffffffffffffff30;
  Reason local_a8;
  undefined1 local_9d;
  int local_9c;
  vec<Lit> local_98;
  int local_88;
  char local_81;
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_64;
  int local_60;
  uint local_5c;
  uint local_c;
  
  local_c = in_ESI;
  BoolView::BoolView((BoolView *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                     (BoolView *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
  BoolView::BoolView((BoolView *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                     (BoolView *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
  BoolView::BoolView((BoolView *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                     (BoolView *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
  local_5c = 0;
  local_60 = 1;
  do {
    if (3 < local_60) {
      puVar3 = &stack0xffffffffffffffd8;
      do {
        puVar3 = puVar3 + -0x10;
        BoolView::~BoolView((BoolView *)0x25fab5);
      } while (puVar3 != &stack0xffffffffffffffa8);
      return;
    }
    for (local_64 = 0; (int)local_64 < 8; local_64 = local_64 + 1) {
      iVar2 = bitcount<int>(local_64);
      if (iVar2 == local_60) {
        for (local_78 = 0; (int)local_78 < 8; local_78 = local_78 + 1) {
          if ((local_78 & (local_64 ^ 0xffffffff)) == 0) {
            local_7c = 0;
            for (local_80 = 0; (int)local_80 < 8; local_80 = local_80 + 1) {
              local_81 = '\x01';
              for (local_88 = 0; local_88 < 3; local_88 = local_88 + 1) {
                if (((local_64 & 1 << ((byte)local_88 & 0x1f)) != 0) &&
                   (((local_80 ^ local_78) & 1 << ((byte)local_88 & 0x1f)) == 0)) {
                  local_81 = '\0';
                }
              }
              if (local_81 != '\0') {
                local_7c = 1 << ((byte)local_80 & 0x1f) | local_7c;
              }
            }
            if (((local_c & local_7c) == 0) && ((local_7c & (local_5c ^ 0xffffffff)) != 0)) {
              vec<Lit>::vec(&local_98);
              for (local_9c = 0; local_9c < 3; local_9c = local_9c + 1) {
                if ((local_64 & 1 << ((byte)local_9c & 0x1f)) != 0) {
                  local_9d = ((int)local_78 >> ((byte)local_9c & 0x1f) & 1U) != 0;
                  if ((local_60 == 1) &&
                     (bVar1 = BoolView::setValNotR
                                        ((BoolView *)
                                         CONCAT17(in_stack_ffffffffffffff07,
                                                  in_stack_ffffffffffffff00),
                                         (bool)in_stack_fffffffffffffeff), bVar1)) {
                    in_stack_ffffffffffffff30 =
                         (SAT *)(&stack0xffffffffffffffa8 + (long)local_9c * 0x10);
                    Reason::Reason(&local_a8,(Clause *)0x0);
                    bVar1 = BoolView::setVal(in_stack_ffffffffffffff08,
                                             (bool)in_stack_ffffffffffffff07,
                                             (Reason)in_stack_ffffffffffffff10);
                    in_stack_ffffffffffffff2c = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff2c);
                    if (((bVar1 ^ 0xffU) & 1) != 0) {
                      printf("=====UNSATISFIABLE=====\n");
                      printf("%% Top level failure!\n");
                      exit(0);
                    }
                  }
                  in_stack_ffffffffffffff28 =
                       BoolView::getLit((BoolView *)
                                        CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8
                                                ),false);
                  vec<Lit>::push((vec<Lit> *)in_stack_ffffffffffffff10._pt,
                                 (Lit *)in_stack_ffffffffffffff08);
                }
              }
              if (1 < local_60) {
                SAT::addClause(in_stack_ffffffffffffff30,
                               (vec<Lit> *)
                               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28.x),
                               SUB81((ulong)in_stack_ffffffffffffff20 >> 0x38,0));
              }
              local_5c = local_7c | local_5c;
              vec<Lit>::~vec((vec<Lit> *)
                             CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
            }
          }
        }
      }
    }
    local_60 = local_60 + 1;
  } while( true );
}

Assistant:

void bool_rel(BoolView x, BoolRelType t, BoolView y, BoolView z) {
	//	NOT_SUPPORTED;
	const BoolView v[3] = {std::move(x), std::move(y), std::move(z)};
	int u = 0;

	for (int l = 1; l <= 3; l++) {
		for (int i = 0; i < 8; i++) {
			if (bitcount<int>(i) != l) {
				continue;
			}
			for (int j = 0; j < 8; j++) {
				if ((j & ~i) != 0) {
					continue;
				}
				int flags = 0;
				for (int k = 0; k < 8; k++) {
					bool pass = true;
					for (int m = 0; m < 3; m++) {
						if ((i & (1 << m)) == 0) {
							continue;
						}
						if (((k ^ j) & (1 << m)) == 0) {
							pass = false;
						}
					}
					if (pass) {
						flags |= (1 << k);
					}
				}
				if ((t & flags) != 0) {
					continue;
				}
				if ((flags & ~u) == 0) {
					continue;
				}
				vec<Lit> ps;
				for (int m = 0; m < 3; m++) {
					if ((i & (1 << m)) == 0) {
						continue;
					}
					const bool p = ((j >> m) & 1) != 0;
					if (l == 1) {
						if (v[m].setValNotR(p)) {
							if (!v[m].setVal(p)) {
								TL_FAIL();
							}
						}
					}
					ps.push(v[m].getLit(p));
				}
				if (l >= 2) {
					sat.addClause(ps);
				}
				u |= flags;
			}
		}
	}
}